

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int clamp(int value,int prec,int sgnd)

{
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int sgnd_local;
  int prec_local;
  int value_local;
  
  if (sgnd == 0) {
    if (prec < 9) {
      if (value < 0) {
        local_34 = 0;
      }
      else {
        local_38 = value;
        if (0xff < value) {
          local_38 = 0xff;
        }
        local_34 = local_38;
      }
      prec_local = local_34;
    }
    else {
      prec_local = value;
      if (prec < 0x11) {
        if (value < 0) {
          local_3c = 0;
        }
        else {
          local_40 = value;
          if (0xffff < value) {
            local_40 = 0xffff;
          }
          local_3c = local_40;
        }
        prec_local = local_3c;
      }
    }
  }
  else if (prec < 9) {
    if (value < -0x80) {
      local_1c = -0x80;
    }
    else {
      local_20 = value;
      if (0x7f < value) {
        local_20 = 0x7f;
      }
      local_1c = local_20;
    }
    prec_local = local_1c;
  }
  else if (prec < 0x11) {
    if (value < -0x8000) {
      local_24 = -0x8000;
    }
    else {
      local_28 = value;
      if (0x7fff < value) {
        local_28 = 0x7fff;
      }
      local_24 = local_28;
    }
    prec_local = local_24;
  }
  else {
    if (value < -0x80000000) {
      local_2c = -0x80000000;
    }
    else {
      local_30 = value;
      if (0x7fffffff < value) {
        local_30 = 0x7fffffff;
      }
      local_2c = local_30;
    }
    prec_local = local_2c;
  }
  return prec_local;
}

Assistant:

static INLINE int clamp(const int value, const int prec, const int sgnd)
{
    if (sgnd) {
        if (prec <= 8) {
            return CLAMP(value, -128, 127);
        } else if (prec <= 16) {
            return CLAMP(value, -32768, 32767);
        } else {
            return CLAMP(value, -2147483647 - 1, 2147483647);
        }
    } else {
        if (prec <= 8) {
            return CLAMP(value, 0, 255);
        } else if (prec <= 16) {
            return CLAMP(value, 0, 65535);
        } else {
            return value;    /*CLAMP(value,0,4294967295);*/
        }
    }
}